

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpAuxiliary
               (OpCode op,OpLayoutAuxiliary *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PropertyIdArray *pPVar5;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar6;
  AuxArray<void_*> *pAVar7;
  AuxArray<int> *pAVar8;
  AuxArray<double> *pAVar9;
  VarArrayVarCount *pVVar10;
  undefined4 *puVar11;
  uint local_88;
  int i_4;
  int count;
  VarArrayVarCount *vars_1;
  uint i_3;
  AuxArray<double> *dblArray;
  uint i_2;
  AuxArray<int> *intArray;
  uint i_1;
  VarArray *vars;
  PropertyRecord *pPropertyName;
  uint i;
  ScriptContext *scriptContext;
  PropertyIdArray *propIds;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutAuxiliary *playout_local;
  OpCode op_local;
  
  switch(op) {
  case StArrSegItem_A:
    pAVar7 = ByteCodeReader::ReadAuxArray<void*>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    DumpReg(playout->R0);
    Output::Print(L"= %d [",(ulong)pAVar7->count);
    for (intArray._4_4_ = 0; intArray._4_4_ < pAVar7->count && intArray._4_4_ < 3;
        intArray._4_4_ = intArray._4_4_ + 1) {
      if (intArray._4_4_ != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",pAVar7[(ulong)intArray._4_4_ + 1]);
    }
    if (intArray._4_4_ != pAVar7->count) {
      Output::Print(L", ...");
    }
    Output::Print(L"]");
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x60b,"(false)","Unknown OpCode for OpLayoutType::Auxiliary");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
    break;
  case LdPropIds:
  case NewScObjectLiteral:
    pPVar5 = ByteCodeReader::ReadPropertyIdArray
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    DumpReg(playout->R0);
    Output::Print(L"= %d [",(ulong)pPVar5->count);
    for (pPropertyName._4_4_ = 0; pPropertyName._4_4_ < pPVar5->count && pPropertyName._4_4_ < 3;
        pPropertyName._4_4_ = pPropertyName._4_4_ + 1) {
      this_00 = ScriptContext::GetPropertyName(this,(&pPVar5[1].count)[pPropertyName._4_4_]);
      if (pPropertyName._4_4_ != 0) {
        Output::Print(L", ");
      }
      pcVar6 = PropertyRecord::GetBuffer(this_00);
      Output::Print(L"%s",pcVar6);
    }
    if (2 < pPVar5->count) {
      Output::Print(L", ...");
    }
    Output::Print(L"], LiteralId %d",(ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1);
    break;
  case NewScObject_A:
    pVVar10 = ByteCodeReader::ReadVarArrayVarCount
                        ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    DumpReg(playout->R0);
    uVar3 = TaggedInt::ToInt32(pVVar10->count);
    Output::Print(L"= %d [",(ulong)uVar3);
    for (local_88 = 0; (int)local_88 < (int)uVar3 && (int)local_88 < 3; local_88 = local_88 + 1) {
      if (local_88 != 0) {
        Output::Print(L", ");
      }
      bVar2 = TaggedInt::Is(pVVar10[(long)(int)local_88 + 1].count);
      if (bVar2) {
        uVar4 = TaggedInt::ToInt32(pVVar10[(long)(int)local_88 + 1].count);
        Output::Print(L"%d",(ulong)uVar4);
      }
      else {
        bVar2 = JavascriptNumber::Is(pVVar10[(long)(int)local_88 + 1].count);
        if (bVar2) {
          JavascriptNumber::GetValue(pVVar10[(long)(int)local_88 + 1].count);
          Output::Print(L"%g");
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x600,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
    }
    if (local_88 != uVar3) {
      Output::Print(L", ...");
    }
    Output::Print(L"]");
    break;
  case NewScIntArray:
    pAVar8 = ByteCodeReader::ReadAuxArray<int>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar8->count);
    for (dblArray._4_4_ = 0; dblArray._4_4_ < pAVar8->count && dblArray._4_4_ < 3;
        dblArray._4_4_ = dblArray._4_4_ + 1) {
      if (dblArray._4_4_ != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pAVar8[(ulong)dblArray._4_4_ + 1].count);
    }
    if (dblArray._4_4_ != pAVar8->count) {
      Output::Print(L", ...");
    }
    Output::Print(L"]");
    break;
  case NewScFltArray:
    pAVar9 = ByteCodeReader::ReadAuxArray<double>
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar9->count);
    for (vars_1._4_4_ = 0; vars_1._4_4_ < pAVar9->count && vars_1._4_4_ < 3;
        vars_1._4_4_ = vars_1._4_4_ + 1) {
      if (vars_1._4_4_ != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%f",pAVar9[(ulong)vars_1._4_4_ + 1]);
    }
    if (vars_1._4_4_ != pAVar9->count) {
      Output::Print(L", ...");
    }
    Output::Print(L"]");
  }
  return;
}

Assistant:

void
    ByteCodeDumper::DumpAuxiliary(OpCode op, const unaligned OpLayoutAuxiliary * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewScObjectLiteral:
            case OpCode::LdPropIds:
            {
                const Js::PropertyIdArray *propIds = reader.ReadPropertyIdArray(playout->Offset, dumpFunction);
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), propIds->count);
                for (uint i=0; i< propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                if (propIds->count >= 3)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("], LiteralId %d"), playout->C1);
                break;
            }
            case OpCode::StArrSegItem_A:
            {
                const Js::VarArray *vars = reader.ReadAuxArray<Var>(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), vars->count);
                uint i=0;
                for (; i<vars->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), vars->elements[i]);
                }
                if (i != vars->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScIntArray:
            {
                const Js::AuxArray<int32> *intArray = reader.ReadAuxArray<int32>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, intArray->count);
                uint i;
                for (i = 0; i<intArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), intArray->elements[i]);
                }
                if (i != intArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScFltArray:
            {
                const Js::AuxArray<double> *dblArray = reader.ReadAuxArray<double>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, dblArray->count);
                uint i;
                for (i = 0; i<dblArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%f"), dblArray->elements[i]);
                }
                if (i != dblArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScObject_A:
            {
                const Js::VarArrayVarCount *vars = reader.ReadVarArrayVarCount(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                int count = Js::TaggedInt::ToInt32(vars->count);
                Output::Print(_u("= %d ["), count);
                int i=0;
                for (; i<count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    if (TaggedInt::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%d"), TaggedInt::ToInt32(vars->elements[i]));
                    }
                    else if (JavascriptNumber::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%g"), JavascriptNumber::GetValue(vars->elements[i]));
                    }
                    else
                    {
                        Assert(false);
                    }
                }
                if (i != count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::Auxiliary");
                break;
        }
    }